

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scantoken.cpp
# Opt level: O3

void __thiscall YAML::Scanner::ScanFlowEnd(Scanner *this)

{
  bool bVar1;
  char cVar2;
  _Elt_pointer pFVar3;
  Exception *pEVar4;
  _Elt_pointer pFVar5;
  _Elt_pointer pFVar6;
  Mark local_88;
  undefined1 local_78 [32];
  size_type local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  undefined1 local_40 [32];
  
  pFVar3 = (this->m_flows).c.
           super__Deque_base<YAML::Scanner::FLOW_MARKER,_std::allocator<YAML::Scanner::FLOW_MARKER>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pFVar3 == (this->m_flows).c.
                super__Deque_base<YAML::Scanner::FLOW_MARKER,_std::allocator<YAML::Scanner::FLOW_MARKER>_>
                ._M_impl.super__Deque_impl_data._M_start._M_cur) {
    pEVar4 = (Exception *)__cxa_allocate_exception(0x40);
    local_88.pos = (this->INPUT).m_mark.pos;
    local_88.line = (this->INPUT).m_mark.line;
    local_88.column = (this->INPUT).m_mark.column;
    local_78._0_8_ = local_78 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"illegal flow end","");
    Exception::Exception(pEVar4,&local_88,(string *)local_78);
    *(undefined ***)pEVar4 = &PTR__BadFile_008779d0;
    __cxa_throw(pEVar4,&ParserException::typeinfo,BadFile::~BadFile);
  }
  pFVar5 = (this->m_flows).c.
           super__Deque_base<YAML::Scanner::FLOW_MARKER,_std::allocator<YAML::Scanner::FLOW_MARKER>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_first;
  pFVar6 = pFVar3;
  if (pFVar3 == pFVar5) {
    pFVar6 = (this->m_flows).c.
             super__Deque_base<YAML::Scanner::FLOW_MARKER,_std::allocator<YAML::Scanner::FLOW_MARKER>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x80;
  }
  if (pFVar6[-1] == FLOW_MAP) {
    bVar1 = VerifySimpleKey(this);
    if (bVar1) {
      local_78._8_4_ = (this->INPUT).m_mark.pos;
      local_78._12_4_ = (this->INPUT).m_mark.line;
      local_78._16_4_ = (this->INPUT).m_mark.column;
      local_78._0_8_ = (pointer)0xf00000000;
      local_58 = 0;
      local_50._M_local_buf[0] = '\0';
      local_40._0_8_ = (pointer)0x0;
      local_40._8_4_ = 0;
      local_40._12_4_ = 0;
      local_40._16_4_ = 0;
      local_40._20_8_ = 0;
      local_78._24_8_ = &local_50;
      std::deque<YAML::Token,_std::allocator<YAML::Token>_>::emplace_back<YAML::Token>
                (&(this->m_tokens).c,(Token *)local_78);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_40);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._24_8_ != &local_50) {
        operator_delete((void *)local_78._24_8_);
      }
      goto LAB_00716466;
    }
    pFVar3 = (this->m_flows).c.
             super__Deque_base<YAML::Scanner::FLOW_MARKER,_std::allocator<YAML::Scanner::FLOW_MARKER>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    pFVar5 = (this->m_flows).c.
             super__Deque_base<YAML::Scanner::FLOW_MARKER,_std::allocator<YAML::Scanner::FLOW_MARKER>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_first;
  }
  if (pFVar3 == pFVar5) {
    pFVar3 = (this->m_flows).c.
             super__Deque_base<YAML::Scanner::FLOW_MARKER,_std::allocator<YAML::Scanner::FLOW_MARKER>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x80;
  }
  if (pFVar3[-1] == FLOW_SEQ) {
    InvalidateSimpleKey(this);
  }
LAB_00716466:
  this->m_simpleKeyAllowed = false;
  this->m_canBeJSONFlow = true;
  local_88.pos = (this->INPUT).m_mark.pos;
  local_88.line = (this->INPUT).m_mark.line;
  local_88.column = (this->INPUT).m_mark.column;
  cVar2 = YAML::Stream::get(&this->INPUT);
  pFVar3 = (this->m_flows).c.
           super__Deque_base<YAML::Scanner::FLOW_MARKER,_std::allocator<YAML::Scanner::FLOW_MARKER>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pFVar3 == (this->m_flows).c.
                super__Deque_base<YAML::Scanner::FLOW_MARKER,_std::allocator<YAML::Scanner::FLOW_MARKER>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_first) {
    pFVar3 = (this->m_flows).c.
             super__Deque_base<YAML::Scanner::FLOW_MARKER,_std::allocator<YAML::Scanner::FLOW_MARKER>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x80;
  }
  if (pFVar3[-1] == (uint)(cVar2 == ']')) {
    std::deque<YAML::Scanner::FLOW_MARKER,_std::allocator<YAML::Scanner::FLOW_MARKER>_>::pop_back
              (&(this->m_flows).c);
    local_78._0_8_ = (ulong)(cVar2 == ']') << 0x20 ^ 0xb00000000;
    local_78._8_4_ = local_88.pos;
    local_78._12_4_ = local_88.line;
    local_78._16_4_ = local_88.column;
    local_58 = 0;
    local_50._M_local_buf[0] = '\0';
    local_40._0_8_ = (pointer)0x0;
    local_40._8_4_ = 0;
    local_40._12_4_ = 0;
    local_40._16_4_ = 0;
    local_40._20_8_ = 0;
    local_78._24_8_ = &local_50;
    std::deque<YAML::Token,_std::allocator<YAML::Token>_>::emplace_back<YAML::Token>
              (&(this->m_tokens).c,(Token *)local_78);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._24_8_ != &local_50) {
      operator_delete((void *)local_78._24_8_);
    }
    return;
  }
  pEVar4 = (Exception *)__cxa_allocate_exception(0x40);
  local_78._0_8_ = local_78 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"illegal flow end","");
  Exception::Exception(pEVar4,&local_88,(string *)local_78);
  *(undefined ***)pEVar4 = &PTR__BadFile_008779d0;
  __cxa_throw(pEVar4,&ParserException::typeinfo,BadFile::~BadFile);
}

Assistant:

void Scanner::ScanFlowEnd() {
  if (InBlockContext())
    throw ParserException(INPUT.mark(), ErrorMsg::FLOW_END);

  // we might have a solo entry in the flow context
  if (InFlowContext()) {
    if (m_flows.top() == FLOW_MAP && VerifySimpleKey())
      m_tokens.push(Token(Token::VALUE, INPUT.mark()));
    else if (m_flows.top() == FLOW_SEQ)
      InvalidateSimpleKey();
  }

  m_simpleKeyAllowed = false;
  m_canBeJSONFlow = true;

  // eat
  Mark mark = INPUT.mark();
  char ch = INPUT.get();

  // check that it matches the start
  FLOW_MARKER flowType = (ch == Keys::FlowSeqEnd ? FLOW_SEQ : FLOW_MAP);
  if (m_flows.top() != flowType)
    throw ParserException(mark, ErrorMsg::FLOW_END);
  m_flows.pop();

  Token::TYPE type = (flowType ? Token::FLOW_SEQ_END : Token::FLOW_MAP_END);
  m_tokens.push(Token(type, mark));
}